

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O2

JPPV_sharedPtr __thiscall
JointPolicyPureVectorForClusteredBG::ToJointPolicyPureVector
          (JointPolicyPureVectorForClusteredBG *this)

{
  int *piVar1;
  PlanningUnitDecPOMDPDiscrete *pPVar2;
  size_type __n;
  sp_counted_base *psVar3;
  element_type *peVar4;
  size_t sVar5;
  sp_counted_base *tmp;
  JointPolicyPureVector *this_00;
  reference ppJVar6;
  reference this_01;
  shared_count extraout_RDX;
  uint uVar7;
  JointPolicyPureVectorForClusteredBG *in_RSI;
  Interface_ProblemToPolicyDiscretePure *pu;
  Index ts;
  ulong uVar8;
  JPPV_sharedPtr JVar9;
  shared_ptr<const_BayesianGameWithClusterInfo> local_b8;
  BGwCI_constPtr bg;
  JointPolicyPureVector *local_98;
  shared_count sStack_90;
  JointPolicyPureVectorForClusteredBG *local_88;
  PlanningUnitDecPOMDPDiscrete *local_80;
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  bgVec;
  vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
  jpolBGVec;
  JPPV_sharedPtr local_48;
  
  pPVar2 = (((in_RSI->_m_bg).px)->super_BayesianGameForDecPOMDPStage)._m_pu;
  this_00 = (JointPolicyPureVector *)operator_new(0x98);
  pu = &(pPVar2->super_PlanningUnitMADPDiscrete).super_Interface_ProblemToPolicyDiscretePure;
  if (pPVar2 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pu = (Interface_ProblemToPolicyDiscretePure *)0x0;
  }
  JointPolicyPureVector::JointPolicyPureVector(this_00,pu,OHIST_INDEX);
  boost::shared_ptr<JointPolicyPureVector>::shared_ptr<JointPolicyPureVector>
            ((shared_ptr<JointPolicyPureVector> *)this,this_00);
  __n = (pPVar2->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon;
  bg.px = (element_type *)0x0;
  bg.pn.pi_ = (sp_counted_base *)0x0;
  std::vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>::
  vector(&jpolBGVec,__n,(allocator_type *)&bgVec);
  local_80 = pPVar2;
  std::
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  ::vector(&bgVec,__n,(allocator_type *)&local_b8);
  uVar8 = 0;
  uVar7 = 0;
  local_88 = in_RSI;
  do {
    ts = (Index)uVar8;
    if (__n <= uVar7) {
LAB_003fb8bc:
      local_48.px = (element_type *)
                    (this->super_PartialJointPolicyPureVector).super_PartialJointPolicyDiscretePure.
                    super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy.
                    _vptr_JointPolicy;
      local_48.pn.pi_ =
           (sp_counted_base *)
           (this->super_PartialJointPolicyPureVector).super_PartialJointPolicyDiscretePure.
           super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy._m_depth;
      sVar5 = (this->super_PartialJointPolicyPureVector).super_PartialJointPolicyDiscretePure.
              super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy._m_depth;
      if (sVar5 != 0) {
        LOCK();
        piVar1 = (int *)(sVar5 + 8);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      StartRecursiveConstructionPerAgent(local_88,local_80,&local_48,ts,&jpolBGVec,&bgVec);
      boost::detail::shared_count::~shared_count(&local_48.pn);
      std::
      vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
      ::~vector(&bgVec);
      std::
      _Vector_base<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
      ::~_Vector_base(&jpolBGVec.
                       super__Vector_base<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                     );
      boost::detail::shared_count::~shared_count(&bg.pn);
      JVar9.pn.pi_ = extraout_RDX.pi_;
      JVar9.px = (element_type *)this;
      return JVar9;
    }
    local_b8.px = (in_RSI->_m_bg).px;
    local_b8.pn.pi_ = (in_RSI->_m_bg).pn.pi_;
    psVar3 = (in_RSI->_m_bg).pn.pi_;
    if (psVar3 != (sp_counted_base *)0x0) {
      LOCK();
      piVar1 = &psVar3->use_count_;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    uVar8 = ~(ulong)uVar7 + __n;
    boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator=(&bg,&local_b8);
    boost::detail::shared_count::~shared_count(&local_b8.pn);
    ts = (Index)uVar8;
    ppJVar6 = std::
              vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
              ::at(&jpolBGVec,uVar8 & 0xffffffff);
    *ppJVar6 = (value_type)in_RSI;
    this_01 = std::
              vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
              ::at(&bgVec,uVar8 & 0xffffffff);
    boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator=(this_01,&bg);
    if ((ts != 0) &&
       (in_RSI = (in_RSI->_m_prevJPolBG).px, in_RSI == (JointPolicyPureVectorForClusteredBG *)0x0))
    {
      peVar4 = (element_type *)
               ((bg.px)->super_BayesianGameForDecPOMDPStage).
               super_BayesianGameForDecPOMDPStageInterface._m_pJPol.px;
      local_b8.pn.pi_ =
           ((bg.px)->super_BayesianGameForDecPOMDPStage).super_BayesianGameForDecPOMDPStageInterface
           ._m_pJPol.pn.pi_;
      if (local_b8.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_b8.pn.pi_)->use_count_ = (local_b8.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      local_98 = (JointPolicyPureVector *)0x0;
      sStack_90.pi_ = (sp_counted_base *)0x0;
      local_b8.px = peVar4;
      boost::detail::shared_count::~shared_count(&sStack_90);
      (*(((JointPolicyDiscrete *)
         &(peVar4->super_BayesianGameForDecPOMDPStage).super_BayesianGameForDecPOMDPStageInterface)
        ->super_JointPolicy)._vptr_JointPolicy[0x14])(&local_98,peVar4);
      JointPolicyPureVector::operator=
                ((JointPolicyPureVector *)
                 (this->super_PartialJointPolicyPureVector).super_PartialJointPolicyDiscretePure.
                 super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy.
                 _vptr_JointPolicy,local_98);
      boost::detail::shared_count::~shared_count(&sStack_90);
      boost::detail::shared_count::~shared_count(&local_b8.pn);
      goto LAB_003fb8bc;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

JPPV_sharedPtr 
JointPolicyPureVectorForClusteredBG::ToJointPolicyPureVector() const
{
#if DEBUG_TOJPPV
    cout << ">>>JointPolicyPureVectorForClusteredBG::ToJointPolicyPureVector() started"<<endl;
#endif
    const PlanningUnitDecPOMDPDiscrete* pu = _m_bg->GetPUDecPOMDPDiscrete();
    JPPV_sharedPtr jppv = 
        JPPV_sharedPtr(
            new JointPolicyPureVector(pu, PolicyGlobals::OHIST_INDEX ));

    size_t h = pu->GetHorizon();
    
    const JointPolicyPureVectorForClusteredBG* jpolBG = this;
    BGwCI_constPtr bg;
    vector<const JointPolicyDiscretePure* > jpolBGVec(h);
    vector<BGwCI_constPtr> bgVec(h);
    Index t=0;
    //for(t=h-1; t >= 0; t--) //<- this never terminates (t is unsigned)
    for(Index t_inv = 0; t_inv < h; t_inv++)
    {
        t = h - 1 - t_inv;
        bg =  jpolBG->GetBG();
#if DEBUG_TOJPPV
        cout << ">>>t="<<t<<" jpolBG: "<< endl<< jpolBG->SoftPrint() <<endl;
        cout << ">>>corresponding BG:" << endl << bg->SoftPrint() << endl;
#endif
        jpolBGVec.at(t) = jpolBG;
        bgVec.at(t) = bg;
        if( t > 0  )
        {
            jpolBG = jpolBG->_m_prevJPolBG.get();
            if(jpolBG == 0)
            {
#if DEBUG_TOJPPV
                cout << ">>>t=" << t
                     << "apparently for stages 0...t a different type of policy is used" << endl;
#endif
                //apparently for stages 0...t a different type of policy is used
                //we get it from the BG:
                boost::shared_ptr<const JointPolicyDiscretePure> jp = bg->GetPastJointPolicy();
                *jppv = *(jp->ToJointPolicyPureVector());
                break;
            }
        }
    }
    // 
#if DEBUG_TOJPPV
    cout << ">>>About to start StartRecursiveConstructionPerAgent... t="<<t<<endl;
#endif

    StartRecursiveConstructionPerAgent(pu, jppv, t, jpolBGVec, bgVec);
    return jppv;

}